

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void __thiscall
SimpleLogger::findMinMaxRevNum(SimpleLogger *this,size_t *min_revnum_out,size_t *max_revnum_out)

{
  long lVar1;
  DIR *__dirp;
  dirent *pdVar2;
  size_t sVar3;
  size_t sVar4;
  SimpleLogger *this_00;
  bool min_revnum_initialized;
  allocator local_b1;
  size_t max_revnum;
  size_t min_revnum;
  size_t *local_a0;
  size_t *local_98;
  string f_name;
  string file_name_only;
  string dir_path;
  
  std::__cxx11::string::string((string *)&dir_path,"./",(allocator *)&file_name_only);
  std::__cxx11::string::string((string *)&file_name_only,(string *)this);
  lVar1 = std::__cxx11::string::rfind((char *)this,0x10eb03);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&f_name,(ulong)this);
    std::__cxx11::string::operator=((string *)&dir_path,(string *)&f_name);
    std::__cxx11::string::~string((string *)&f_name);
    std::__cxx11::string::substr((ulong)&f_name,(ulong)this);
    std::__cxx11::string::operator=((string *)&file_name_only,(string *)&f_name);
    std::__cxx11::string::~string((string *)&f_name);
  }
  min_revnum_initialized = false;
  min_revnum = 0;
  max_revnum = 0;
  __dirp = opendir(dir_path._M_dataplus._M_p);
  if (__dirp == (DIR *)0x0) {
    sVar3 = 0;
    sVar4 = 0;
  }
  else {
    local_a0 = min_revnum_out;
    local_98 = max_revnum_out;
    while( true ) {
      pdVar2 = readdir(__dirp);
      if (pdVar2 == (dirent *)0x0) break;
      std::__cxx11::string::string((string *)&f_name,pdVar2->d_name,&local_b1);
      this_00 = (SimpleLogger *)&f_name;
      lVar1 = std::__cxx11::string::rfind((string *)&f_name,(ulong)&file_name_only);
      if (lVar1 != -1) {
        findMinMaxRevNumInternal(this_00,&min_revnum_initialized,&min_revnum,&max_revnum,&f_name);
      }
      std::__cxx11::string::~string((string *)&f_name);
    }
    closedir(__dirp);
    sVar3 = max_revnum;
    sVar4 = min_revnum;
    max_revnum_out = local_98;
    min_revnum_out = local_a0;
  }
  *min_revnum_out = sVar4;
  *max_revnum_out = sVar3;
  std::__cxx11::string::~string((string *)&file_name_only);
  std::__cxx11::string::~string((string *)&dir_path);
  return;
}

Assistant:

void SimpleLogger::findMinMaxRevNum( size_t& min_revnum_out,
                                     size_t& max_revnum_out )
{
    std::string dir_path = "./";
    std::string file_name_only = filePath;
    size_t last_pos = filePath.rfind("/");
    if (last_pos != std::string::npos) {
        dir_path = filePath.substr(0, last_pos);
        file_name_only = filePath.substr
                         ( last_pos + 1, filePath.size() - last_pos - 1 );
    }

    bool min_revnum_initialized = false;
    size_t min_revnum = 0;
    size_t max_revnum = 0;

#if defined(__linux__) || defined(__APPLE__)
    DIR* dir_info = opendir(dir_path.c_str());
    struct dirent *dir_entry = nullptr;
    while ( dir_info && (dir_entry = readdir(dir_info)) ) {
        std::string f_name(dir_entry->d_name);
        size_t f_name_pos = f_name.rfind(file_name_only);
        // Irrelavent file: skip.
        if (f_name_pos == std::string::npos) continue;

        findMinMaxRevNumInternal(min_revnum_initialized,
                                 min_revnum,
                                 max_revnum,
                                 f_name);
    }
    if (dir_info) {
        closedir(dir_info);
    }
#elif defined(WIN32) || defined(_WIN32)
    // Windows
    WIN32_FIND_DATA filedata;
    HANDLE hfind;
    std::string query_str = dir_path + "*";

    // find all files start with 'prefix'
    hfind = FindFirstFile(query_str.c_str(), &filedata);
    while (hfind != INVALID_HANDLE_VALUE) {
        std::string f_name(filedata.cFileName);
        size_t f_name_pos = f_name.rfind(file_name_only);
        // Irrelavent file: skip.
        if (f_name_pos != std::string::npos) {
            findMinMaxRevNumInternal(min_revnum_initialized,
                                     min_revnum,
                                     max_revnum,
                                     f_name);
        }

        if (!FindNextFile(hfind, &filedata)) {
            FindClose(hfind);
            hfind = INVALID_HANDLE_VALUE;
        }
    }
#endif

    min_revnum_out = min_revnum;
    max_revnum_out = max_revnum;
}